

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

bool __thiscall doublechecked::Roaring::contains(Roaring *this,uint32_t x)

{
  _Bool _Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  _Var1 = roaring_bitmap_contains((roaring_bitmap_t *)this,x);
  p_Var4 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var4->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar5]) {
    bVar5 = p_Var3[1]._M_color < x;
    if (!bVar5) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var3 = p_Var2, x < p_Var2[1]._M_color)) {
    p_Var3 = &p_Var4->_M_header;
  }
  _assert_true((ulong)(_Var1 != ((_Rb_tree_header *)p_Var3 == p_Var4)),
               "ans == (check.find(x) != check.end())",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,0xad);
  return _Var1;
}

Assistant:

bool contains(uint32_t x) const {
        bool ans = plain.contains(x);
        assert_true(ans == (check.find(x) != check.end()));
        return ans;
    }